

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGenericBoxed.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoGenericBoxed::ArchiveOUT
          (ChConstraintTwoGenericBoxed *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChConstraintTwoGenericBoxed>(marchive);
  ChConstraintTwoGeneric::ArchiveOUT(&this->super_ChConstraintTwoGeneric,marchive);
  local_30._value = &this->l_min;
  local_30._name = "l_min";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->l_max;
  local_48._name = "l_max";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChConstraintTwoGenericBoxed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintTwoGenericBoxed>();

    // serialize the parent class data too
    ChConstraintTwoGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(l_min);
    marchive << CHNVP(l_max);
}